

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

EnumDescriptorProto *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto>(Arena *arena)

{
  EnumDescriptorProto *in_RDI;
  size_t n;
  Arena **in_stack_ffffffffffffff88;
  EnumDescriptorProto *allocated_type;
  Arena *in_stack_ffffffffffffffa0;
  EnumDescriptorProto *n_00;
  ArenaImpl *in_stack_ffffffffffffffb0;
  undefined8 local_38;
  
  if (in_RDI == (EnumDescriptorProto *)0x0) {
    local_38 = (EnumDescriptorProto *)operator_new(0x70);
    EnumDescriptorProto::EnumDescriptorProto(in_RDI);
  }
  else {
    allocated_type = in_RDI;
    n_00 = in_RDI;
    internal::AlignUpTo8(0x70);
    AllocHook(in_stack_ffffffffffffffa0,(type_info *)allocated_type,(size_t)in_RDI);
    internal::ArenaImpl::AllocateAligned(in_stack_ffffffffffffffb0,(size_t)n_00);
    local_38 = InternalHelper<google::protobuf::EnumDescriptorProto>::
               Construct<google::protobuf::Arena*>(in_RDI,in_stack_ffffffffffffff88);
  }
  return local_38;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::EnumDescriptorProto* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::EnumDescriptorProto >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::EnumDescriptorProto >(arena);
}